

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseTypeVector(JSONParser *this,TypeVector *out_types)

{
  pointer pTVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  bool bVar5;
  Type type;
  
  pTVar1 = (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  RVar3 = Expect(this,"[");
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    bVar5 = true;
    while (bVar2 = Match(this,"]"), !bVar2) {
      if (((!bVar5) && (RVar3 = Expect(this,","), RVar3.enum_ == Error)) ||
         (RVar3 = ParseTypeObject(this,&type), RVar3.enum_ == Error)) {
        return (Result)Error;
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(out_types,&type);
      bVar5 = false;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseTypeVector(TypeVector* out_types) {
  out_types->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    Type type;
    CHECK_RESULT(ParseTypeObject(&type));
    first = false;
    out_types->push_back(type);
  }
  return wabt::Result::Ok;
}